

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_set.hpp
# Opt level: O1

void __thiscall
duckdb::FunctionSet<duckdb::ScalarFunction>::~FunctionSet(FunctionSet<duckdb::ScalarFunction> *this)

{
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (this + 0x20));
  if (*(FunctionSet<duckdb::ScalarFunction> **)this != this + 0x10) {
    operator_delete(*(FunctionSet<duckdb::ScalarFunction> **)this);
    return;
  }
  return;
}

Assistant:

explicit FunctionSet(string name) : name(std::move(name)) {
	}